

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

string * __thiscall
soul::getInitialiserValue_abi_cxx11_(string *__return_storage_ptr__,soul *this,CodeLocation *name)

{
  bool bVar1;
  string local_a8;
  CodeLocation local_88;
  CodeLocation local_78 [2];
  CodeLocation local_58;
  CodeLocation local_48;
  undefined1 local_38 [8];
  CodeLocationRange range;
  CodeLocation *name_local;
  
  range.end.location.data = (char *)this;
  CodeLocationRange::CodeLocationRange((CodeLocationRange *)local_38);
  CodeLocation::CodeLocation(&local_58,(CodeLocation *)this);
  SourceCodeUtilities::findNextOccurrence((SourceCodeUtilities *)&local_48,&local_58,'=');
  CodeLocation::operator=((CodeLocation *)local_38,&local_48);
  CodeLocation::~CodeLocation(&local_48);
  CodeLocation::~CodeLocation(&local_58);
  bVar1 = CodeLocation::isEmpty((CodeLocation *)local_38);
  checkAssertion((bool)(~bVar1 & 1),"! range.start.isEmpty()","getInitialiserValue",0x111);
  UTF8Reader::operator++((UTF8Reader *)&range);
  CodeLocation::CodeLocation(&local_88,(CodeLocation *)local_38);
  SourceCodeUtilities::findEndOfExpression((SourceCodeUtilities *)local_78,&local_88);
  CodeLocation::operator=((CodeLocation *)&range.start.location,local_78);
  CodeLocation::~CodeLocation(local_78);
  CodeLocation::~CodeLocation(&local_88);
  CodeLocationRange::toString_abi_cxx11_(&local_a8,(CodeLocationRange *)local_38);
  choc::text::trim(__return_storage_ptr__,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  CodeLocationRange::~CodeLocationRange((CodeLocationRange *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string getInitialiserValue (CodeLocation name)
{
    CodeLocationRange range;
    range.start = SourceCodeUtilities::findNextOccurrence (name, '=');
    SOUL_ASSERT (! range.start.isEmpty());
    ++(range.start.location);
    range.end = SourceCodeUtilities::findEndOfExpression (range.start);
    return choc::text::trim (range.toString());
}